

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManPrintLutStats(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint nSizeMax;
  ulong uVar6;
  ulong uVar7;
  int pCounts [33];
  int aiStack_98 [36];
  
  memset(aiStack_98,0,0x84);
  nSizeMax = Gia_ManLutSizeMax(p);
  if (0x20 < (int)nSizeMax) {
    Abc_Print(1,"The max LUT size (%d) is too large.\n",(ulong)nSizeMax);
    return;
  }
  iVar1 = p->nObjs;
  if (1 < (long)iVar1) {
    pVVar4 = p->vMapping;
    uVar2 = pVVar4->nSize;
    uVar6 = 1;
    if (1 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    uVar7 = 1;
    do {
      if (uVar6 == uVar7) {
LAB_0020dfec:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = pVVar4->pArray;
      uVar3 = piVar5[uVar7];
      if ((ulong)uVar3 != 0) {
        if (((int)uVar3 < 0) || ((int)uVar2 <= (int)uVar3)) goto LAB_0020dfec;
        aiStack_98[piVar5[uVar3]] = aiStack_98[piVar5[uVar3]] + 1;
      }
      uVar7 = uVar7 + 1;
    } while ((long)iVar1 != uVar7);
  }
  Gia_ManPrintNodeProfile(aiStack_98,nSizeMax);
  return;
}

Assistant:

void Gia_ManPrintLutStats( Gia_Man_t * p )
{
    int i, nSizeMax, pCounts[33] = {0};
    nSizeMax = Gia_ManLutSizeMax( p );
    if ( nSizeMax > 32 )
    {
        Abc_Print( 1, "The max LUT size (%d) is too large.\n", nSizeMax );
        return;
    }
    Gia_ManForEachLut( p, i )
        pCounts[ Gia_ObjLutSize(p, i) ]++;
    Gia_ManPrintNodeProfile( pCounts, nSizeMax );
}